

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamReader_p.cpp
# Opt level: O1

bool __thiscall BamTools::Internal::BamReaderPrivate::Rewind(BamReaderPrivate *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  long *plVar4;
  size_type *psVar5;
  string message;
  string currentError;
  string local_88;
  string local_68;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  BamRandomAccessController::ClearRegion(&this->m_randomAccessController);
  bVar3 = Seek(this,&this->m_alignmentsBeginOffset);
  if (!bVar3) {
    pcVar2 = (this->m_errorString)._M_dataplus._M_p;
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_48,pcVar2,pcVar2 + (this->m_errorString)._M_string_length);
    paVar1 = &local_88.field_2;
    local_88._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"could not rewind: \n\t","")
    ;
    plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_88,(ulong)local_48[0]);
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_68.field_2._M_allocated_capacity = *psVar5;
      local_68.field_2._8_8_ = plVar4[3];
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    }
    else {
      local_68.field_2._M_allocated_capacity = *psVar5;
      local_68._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_68._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar1) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    local_88._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"BamReader::Rewind","");
    SetErrorString(this,&local_88,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar1) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  return bVar3;
}

Assistant:

bool BamReaderPrivate::Rewind(void) {

    // reset region
    m_randomAccessController.ClearRegion();

    // return status of seeking back to first alignment
    if ( Seek(m_alignmentsBeginOffset) )
        return true;
    else {
        const string currentError = m_errorString;
        const string message = string("could not rewind: \n\t") + currentError;
        SetErrorString("BamReader::Rewind", message);
        return false;
    }
}